

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O2

void spvtools::val::anon_unknown_0::ComputeMemberConstraintsForArray
               (MemberConstraints *constraints,uint32_t array_id,LayoutConstraints *inherited,
               ValidationState_t *vstate)

{
  ushort uVar1;
  Instruction *pIVar2;
  
  do {
    pIVar2 = ValidationState_t::FindDef(vstate,array_id);
    array_id = (pIVar2->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[2];
    pIVar2 = ValidationState_t::FindDef(vstate,array_id);
    uVar1 = (pIVar2->inst_).opcode;
  } while (uVar1 - 0x1c < 2);
  if (uVar1 == 0x1e) {
    ComputeMemberConstraintsForStruct(constraints,array_id,inherited,vstate);
    return;
  }
  return;
}

Assistant:

void ComputeMemberConstraintsForArray(MemberConstraints* constraints,
                                      uint32_t array_id,
                                      const LayoutConstraints& inherited,
                                      ValidationState_t& vstate) {
  assert(constraints);
  auto elem_type_id = vstate.FindDef(array_id)->words()[2];
  const auto elem_type_inst = vstate.FindDef(elem_type_id);
  const auto opcode = elem_type_inst->opcode();
  switch (opcode) {
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
      ComputeMemberConstraintsForArray(constraints, elem_type_id, inherited,
                                       vstate);
      break;
    case spv::Op::OpTypeStruct:
      ComputeMemberConstraintsForStruct(constraints, elem_type_id, inherited,
                                        vstate);
      break;
    default:
      break;
  }
}